

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void __thiscall Reader::~Reader(Reader *this)

{
  std::ifstream::close();
  Builder::~Builder(&this->builder);
  std::
  _Rb_tree<LpSectionKeyword,_std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>,_std::_Select1st<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->sectiontokens)._M_t);
  std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>::~vector(&this->processedtokens);
  std::array<RawToken,_3UL>::~array(&this->rawtokens);
  std::__cxx11::string::~string((string *)&this->linebuffer);
  zstr::ifstream::~ifstream(&this->file);
  return;
}

Assistant:

~Reader() { file.close(); }